

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeM34.cpp
# Opt level: O3

bool metric34_line_is_bigger(metric34_line_t x,metric34_line_t y)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = true;
  if ((double)x.domain._56_8_ <= (double)y.domain._56_8_) {
    if (((double)x.domain._56_8_ != (double)y.domain._56_8_) ||
       (NAN((double)x.domain._56_8_) || NAN((double)y.domain._56_8_))) {
      bVar1 = false;
    }
    else {
      iVar2 = CaptureSummary::compare_string(&stack0x00000008,(char *)&x.frequency);
      bVar1 = 0 < iVar2;
    }
  }
  return bVar1;
}

Assistant:

bool metric34_line_is_bigger(metric34_line_t x, metric34_line_t y)
{
    bool ret = false;

    if (x.frequency > y.frequency)
    {
        ret = true;
    }
    else if (x.frequency == y.frequency)
    {
        ret = CaptureSummary::compare_string(x.domain, y.domain) > 0;
    }

    return (ret);
}